

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FileOptions_OptimizeMode FVar2;
  char *format_00;
  Formatter format;
  Formatter local_58;
  
  local_58.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_58.vars_._M_t,&(this->variables_)._M_t);
  pDVar1 = this->descriptor_;
  FVar2 = GetOptimizeFor(*(FileDescriptor **)(pDVar1 + 0x10),&this->options_,(bool *)0x0);
  if (((FVar2 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar1 + 0x78) != 0)) ||
     (*(int *)(pDVar1 + 4) != 0)) {
    FVar2 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),&this->options_,
                           (bool *)0x0);
    format_00 = 
    "const ::$proto_ns$::Message::ClassData $classname$::_class_data_ = {\n    ::$proto_ns$::Message::CopyWithSizeCheck,\n    $classname$::MergeImpl\n};\nconst ::$proto_ns$::Message::ClassData*$classname$::GetClassData() const { return &_class_data_; }\n\nvoid $classname$::MergeImpl(::$proto_ns$::Message* to,\n                      const ::$proto_ns$::Message& from) {\n  static_cast<$classname$ *>(to)->MergeFrom(\n      static_cast<const $classname$ &>(from));\n}\n\n"
    ;
    if (FVar2 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      format_00 = 
      "void $classname$::CheckTypeAndMergeFrom(\n    const ::$proto_ns$::MessageLite& from) {\n  MergeFrom(*::$proto_ns$::internal::DownCast<const $classname$*>(\n      &from));\n}\n"
      ;
    }
  }
  else {
    format_00 = 
    "const ::$proto_ns$::Message::ClassData $classname$::_class_data_ = {\n    $superclass$::CopyImpl,\n    $superclass$::MergeImpl,\n};\nconst ::$proto_ns$::Message::ClassData*$classname$::GetClassData() const { return &_class_data_; }\n\n\n"
    ;
  }
  Formatter::operator()<>(&local_58,format_00);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateMergeFrom(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (!HasSimpleBaseClass(descriptor_, options_)) {
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      // We don't override the generalized MergeFrom (aka that which
      // takes in the Message base class as a parameter); instead we just
      // let the base Message::MergeFrom take care of it.  The base MergeFrom
      // knows how to quickly confirm the types exactly match, and if so, will
      // use GetClassData() to retrieve the address of MergeImpl, which calls
      // the fast MergeFrom overload.  Most callers avoid all this by passing
      // a "from" message that is the same type as the message being merged
      // into, rather than a generic Message.

      format(
          "const ::$proto_ns$::Message::ClassData "
          "$classname$::_class_data_ = {\n"
          "    ::$proto_ns$::Message::CopyWithSizeCheck,\n"
          "    $classname$::MergeImpl\n"
          "};\n"
          "const ::$proto_ns$::Message::ClassData*"
          "$classname$::GetClassData() const { return &_class_data_; }\n"
          "\n"
          "void $classname$::MergeImpl(::$proto_ns$::Message* to,\n"
          "                      const ::$proto_ns$::Message& from) {\n"
          "  static_cast<$classname$ *>(to)->MergeFrom(\n"
          "      static_cast<const $classname$ &>(from));\n"
          "}\n"
          "\n");
    } else {
      // Generate CheckTypeAndMergeFrom().
      format(
          "void $classname$::CheckTypeAndMergeFrom(\n"
          "    const ::$proto_ns$::MessageLite& from) {\n"
          "  MergeFrom(*::$proto_ns$::internal::DownCast<const $classname$*>(\n"
          "      &from));\n"
          "}\n");
    }
  } else {
    // In the simple case, we just define ClassData that vectors back to the
    // simple implementation of Copy and Merge.
    format(
        "const ::$proto_ns$::Message::ClassData "
        "$classname$::_class_data_ = {\n"
        "    $superclass$::CopyImpl,\n"
        "    $superclass$::MergeImpl,\n"
        "};\n"
        "const ::$proto_ns$::Message::ClassData*"
        "$classname$::GetClassData() const { return &_class_data_; }\n"
        "\n"
        "\n");
  }
}